

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::ParseErase(Parser *this)

{
  size_t *psVar1;
  bool bVar2;
  uint32_t uVar3;
  PropertyName propName;
  pointer local_80;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  local_58;
  Variant local_48;
  
  bVar2 = CheckProperty(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
  if (bVar2) {
    ParsePropertyName((PropertyName *)local_78,this);
    if (local_78[0xc] == true) {
      Error<>(this,"Can\'t erase a readonly property");
    }
    else {
      uVar3 = ParseSubscriptSet(this);
      Expect(this,NewLine,(char *)0x0);
      if (uVar3 == 0) {
        Error<>(this,"Expected index operator after erase keyword");
      }
      else {
        EmitOpcode(this,ErasePropKeyVal);
        local_80 = (pointer)CONCAT44(local_80._4_4_,uVar3);
        psVar1 = &(this->m_writer).m_pos;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                      &local_80,4);
        local_80 = (pointer)local_78._0_8_;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                      &local_80,8);
      }
    }
    Variant::~Variant(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_78._16_8_ != &local_58) {
      MemFree((void *)local_78._16_8_,local_58._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = CheckVariable(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
    if (!bVar2) {
      Error<>(this,"Valid property or variable name expected after erase keyword");
      return;
    }
    ParseVariable_abi_cxx11_((String *)local_78,this);
    uVar3 = ParseSubscriptSet(this);
    Expect(this,NewLine,(char *)0x0);
    if (uVar3 == 0) {
      EmitOpcode(this,EraseItr);
      local_80 = (pointer)VariableNameToRuntimeID(this,(String *)local_78);
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    &(this->m_writer).m_pos,&local_80,8);
    }
    else {
      EmitOpcode(this,EraseVarKeyVal);
      local_80 = (pointer)CONCAT44(local_80._4_4_,uVar3);
      psVar1 = &(this->m_writer).m_pos;
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                    &local_80,4);
      local_80 = (pointer)VariableNameToRuntimeID(this,(String *)local_78);
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                    &local_80,8);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      MemFree((void *)local_78._0_8_,(size_t)(local_78._16_8_ + 1));
    }
  }
  return;
}

Assistant:

inline_t void Parser::ParseErase()
	{
		if (CheckProperty())
		{
			auto propName = ParsePropertyName();
			if (propName.IsReadOnly())
			{
				Error("Can't erase a readonly property");
				return;
			}
			uint32_t subscripts = ParseSubscriptSet();
			Expect(SymbolType::NewLine);
			if (subscripts)
			{
				EmitOpcode(Opcode::ErasePropKeyVal);
				EmitCount(subscripts);
				EmitId(propName.GetId());
			}
			else
			{
				Error("Expected index operator after erase keyword");
				return;
			}
		}
		else if (CheckVariable())
		{
			auto varName = ParseVariable();
			uint32_t subscripts = ParseSubscriptSet();
			Expect(SymbolType::NewLine);
			if (subscripts)
			{
				EmitOpcode(Opcode::EraseVarKeyVal);
				EmitCount(subscripts);
				EmitId(VariableNameToRuntimeID(varName));
			}
			else
			{
				EmitOpcode(Opcode::EraseItr);
				EmitId(VariableNameToRuntimeID(varName));
			}
		}
		else
		{
			Error("Valid property or variable name expected after erase keyword");
			return;
		}
	}